

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCryptoHash.cxx
# Opt level: O3

string * __thiscall
cmCryptoHash::HashFile(string *__return_storage_ptr__,cmCryptoHash *this,string *file)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *hash;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  ByteHashFile(&local_28,this,file);
  ByteHashToString_abi_cxx11_(__return_storage_ptr__,(cmCryptoHash *)&local_28,hash);
  if (local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCryptoHash::HashFile(const std::string& file)
{
  return ByteHashToString(this->ByteHashFile(file));
}